

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGUIElement.h
# Opt level: O2

bool __thiscall irr::gui::IGUIElement::isMyChild(IGUIElement *this,IGUIElement *child)

{
  IGUIElement *pIVar1;
  
  if (child != (IGUIElement *)0x0) {
    pIVar1 = child->Parent;
    do {
      if (pIVar1 != (IGUIElement *)0x0) {
        child = pIVar1;
      }
      pIVar1 = child->Parent;
    } while ((pIVar1 != (IGUIElement *)0x0) && (child != this));
    return child == this;
  }
  return false;
}

Assistant:

bool isMyChild(IGUIElement *child) const
	{
		if (!child)
			return false;
		do {
			if (child->Parent)
				child = child->Parent;

		} while (child->Parent && child != this);

		return child == this;
	}